

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O0

int prolog1(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  ENCODING *enc_local;
  char *end_local;
  char *ptr_local;
  int tok_local;
  PROLOG_STATE *state_local;
  
  switch(tok) {
  case 0xb:
  case 0xd:
  case 0xe:
    state_local._4_4_ = 0;
    break;
  case 0xf:
    state_local._4_4_ = 0;
    break;
  case 0x10:
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (enc->minBytesPerChar << 1),end,"DOCTYPE");
    if (iVar1 != 0) {
      state->handler = doctype0;
      return 0;
    }
  default:
    state_local._4_4_ = common(state,tok);
    break;
  case 0x1d:
    state->handler = error;
    state_local._4_4_ = 2;
  }
  return state_local._4_4_;
}

Assistant:

static
int prolog1(PROLOG_STATE *state,
            int tok,
            const char *ptr,
            const char *end,
            const ENCODING *enc)
{
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_PI:
  case XML_TOK_COMMENT:
  case XML_TOK_BOM:
    return XML_ROLE_NONE;
  case XML_TOK_DECL_OPEN:
    if (!XmlNameMatchesAscii(enc,
                             ptr + 2 * MIN_BYTES_PER_CHAR(enc),
                             end,
                             KW_DOCTYPE))
      break;
    state->handler = doctype0;
    return XML_ROLE_NONE;
  case XML_TOK_INSTANCE_START:
    state->handler = error;
    return XML_ROLE_INSTANCE_START;
  }
  return common(state, tok);
}